

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaPValAttrNodeID(xmlSchemaParserCtxtPtr ctxt,xmlAttrPtr attr)

{
  xmlIDPtr pxVar1;
  xmlSchemaTypePtr pxVar2;
  xmlChar *strip;
  xmlIDPtr res;
  xmlChar *value;
  int ret;
  xmlAttrPtr attr_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  if (attr == (xmlAttrPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else {
    res = (xmlIDPtr)xmlSchemaGetNodeContentNoDict((xmlNodePtr)attr);
    value._4_4_ = xmlValidateNCName((xmlChar *)res,1);
    if (value._4_4_ == 0) {
      if (attr->atype != XML_ATTRIBUTE_ID) {
        pxVar1 = (xmlIDPtr)xmlSchemaCollapseString((xmlChar *)res);
        if (pxVar1 != (xmlIDPtr)0x0) {
          (*xmlFree)(res);
          res = pxVar1;
        }
        pxVar1 = xmlAddID((xmlValidCtxtPtr)0x0,attr->doc,(xmlChar *)res,attr);
        if (pxVar1 == (xmlIDPtr)0x0) {
          value._4_4_ = 0xbdd;
          pxVar2 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ID);
          xmlSchemaPSimpleTypeErr
                    (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)0x0,
                     (xmlNodePtr)attr,pxVar2,(char *)0x0,(xmlChar *)0x0,
                     "Duplicate value \'%s\' of simple type \'xs:ID\'",(xmlChar *)res,(xmlChar *)0x0
                    );
        }
        else {
          attr->atype = XML_ATTRIBUTE_ID;
        }
      }
    }
    else if (0 < value._4_4_) {
      value._4_4_ = 0xbdd;
      pxVar2 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ID);
      xmlSchemaPSimpleTypeErr
                (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)attr
                 ,pxVar2,(char *)0x0,(xmlChar *)0x0,
                 "The value \'%s\' of simple type \'xs:ID\' is not a valid \'xs:NCName\'",
                 (xmlChar *)res,(xmlChar *)0x0);
    }
    if (res != (xmlIDPtr)0x0) {
      (*xmlFree)(res);
    }
    ctxt_local._4_4_ = value._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaPValAttrNodeID(xmlSchemaParserCtxtPtr ctxt, xmlAttrPtr attr)
{
    int ret;
    const xmlChar *value;

    if (attr == NULL)
	return(0);
    value = xmlSchemaGetNodeContentNoDict((xmlNodePtr) attr);
    ret = xmlValidateNCName(value, 1);
    if (ret == 0) {
	/*
	* NOTE: the IDness might have already be declared in the DTD
	*/
	if (attr->atype != XML_ATTRIBUTE_ID) {
	    xmlIDPtr res;
	    xmlChar *strip;

	    /*
	    * TODO: Use xmlSchemaStrip here; it's not exported at this
	    * moment.
	    */
	    strip = xmlSchemaCollapseString(value);
	    if (strip != NULL) {
		xmlFree((xmlChar *) value);
		value = strip;
	    }
	    res = xmlAddID(NULL, attr->doc, value, attr);
	    if (res == NULL) {
		ret = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    NULL, (xmlNodePtr) attr,
		    xmlSchemaGetBuiltInType(XML_SCHEMAS_ID),
		    NULL, NULL, "Duplicate value '%s' of simple "
		    "type 'xs:ID'", value, NULL);
	    } else
		attr->atype = XML_ATTRIBUTE_ID;
	}
    } else if (ret > 0) {
	ret = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
	xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    NULL, (xmlNodePtr) attr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_ID),
	    NULL, NULL, "The value '%s' of simple type 'xs:ID' is "
	    "not a valid 'xs:NCName'",
	    value, NULL);
    }
    if (value != NULL)
	xmlFree((xmlChar *)value);

    return (ret);
}